

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O2

void __thiscall amrex::Geometry::computeRoundoffDomain(Geometry *this)

{
  Real plo;
  Real idx;
  int ilo;
  int ihi;
  long lVar1;
  float fVar2;
  double dVar3;
  double tol;
  double dVar4;
  double dVar5;
  
  for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 4) {
    dVar3 = *(double *)((long)(this->prob_domain).xhi + lVar1 * 2);
    dVar5 = *(double *)((long)(this->roundoff_hi_d).arr + lVar1 * 2);
    *(double *)((long)(this->super_CoordSys).dx + lVar1 * 2) = dVar3;
    dVar3 = (dVar5 - dVar3) /
            (double)((*(int *)((long)&((IndexType *)(&(this->domain).bigend + 1))->itype + lVar1) -
                     *(int *)((long)(this->domain).bigend.vect + lVar1)) + 1);
    *(double *)((long)(this->super_CoordSys).inv_dx + lVar1 * 2) = dVar3;
    *(double *)((long)(this->prob_domain).xlo + lVar1 * 2 + -8) = 1.0 / dVar3;
  }
  for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 4) {
    ilo = *(int *)((long)(this->domain).bigend.vect + lVar1);
    ihi = *(int *)((long)&((IndexType *)(&(this->domain).bigend + 1))->itype + lVar1);
    plo = *(Real *)((long)(this->prob_domain).xhi + lVar1 * 2);
    dVar3 = *(double *)((long)(this->roundoff_hi_d).arr + lVar1 * 2);
    dVar5 = *(double *)((long)(this->super_CoordSys).inv_dx + lVar1 * 2);
    idx = *(Real *)((long)(this->prob_domain).xlo + lVar1 * 2 + -8);
    dVar4 = dVar5 * 0.0001;
    tol = dVar3 * 2e-07;
    if (dVar3 * 2e-07 <= dVar4) {
      tol = dVar4;
    }
    dVar5 = dVar5 * 1e-08;
    dVar4 = dVar3 * 1e-14;
    if (dVar3 * 1e-14 <= dVar5) {
      dVar4 = dVar5;
    }
    fVar2 = detail::bisect_prob_hi<float>(plo,dVar3,idx,ilo,ihi,tol);
    *(float *)((long)(this->domain).smallend.vect + lVar1) = fVar2;
    dVar3 = detail::bisect_prob_hi<double>(plo,dVar3,idx,ilo,ihi,dVar4);
    *(double *)((long)(this->roundoff_hi_f).arr + lVar1 * 2) = dVar3;
  }
  return;
}

Assistant:

void
Geometry::computeRoundoffDomain ()
{
    for (int k = 0; k < AMREX_SPACEDIM; k++)
    {
        offset[k] = prob_domain.lo(k);
        dx[k] = prob_domain.length(k)/(Real(domain.length(k)));
        inv_dx[k] = 1.0_rt/dx[k];
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        int ilo = Domain().smallEnd(idim);
        int ihi = Domain().bigEnd(idim);
        Real plo = ProbLo(idim);
        Real phi = ProbHi(idim);
        Real idx = InvCellSize(idim);
        Real deltax = CellSize(idim);

        Real ftol = std::max(1.e-4_rt*deltax, 2.e-7_rt*phi);
        Real dtol = std::max(1.e-8_rt*deltax, 1.e-14_rt*phi);

        roundoff_hi_f[idim] = detail::bisect_prob_hi<float> (plo, phi, idx, ilo, ihi, ftol);
        roundoff_hi_d[idim] = detail::bisect_prob_hi<double>(plo, phi, idx, ilo, ihi, dtol);
    }
}